

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_cpu_features.c
# Opt level: O3

void printJson(Node *current)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  int __c;
  
  do {
    switch(current->type) {
    case NT_INT:
      printf("%d",(ulong)current->integer);
      return;
    case NT_MAP:
      putchar(0x7b);
      if (current->next != (Node *)0x0) {
        printJson(current->next);
      }
      __c = 0x7d;
      goto LAB_00102c2b;
    case NT_MAP_ENTRY:
      printf("\"%s\":",current->string);
    case NT_ARRAY_ELEMENT:
      printJson(current->value);
      if (current->next == (Node *)0x0) {
switchD_00102b48_default:
        return;
      }
      putchar(0x2c);
      current = current->next;
      break;
    case NT_ARRAY:
      putchar(0x5b);
      if (current->next != (Node *)0x0) {
        printJson(current->next);
      }
      __c = 0x5d;
      goto LAB_00102c2b;
    case NT_STRING:
      pbVar3 = (byte *)current->string;
      putchar(0x22);
      if (pbVar3 != (byte *)0x0) goto LAB_00102bf2;
      goto LAB_00102c26;
    default:
      goto switchD_00102b48_default;
    }
  } while( true );
LAB_00102bf2:
  bVar1 = *pbVar3;
  uVar2 = (ulong)bVar1;
  if (uVar2 < 0x30) {
    if ((0x800400003700U >> (uVar2 & 0x3f) & 1) == 0) {
      if (uVar2 == 0) {
LAB_00102c26:
        __c = 0x22;
LAB_00102c2b:
        putchar(__c);
        return;
      }
      goto LAB_00102c1f;
    }
LAB_00102c01:
    putchar(0x5c);
    bVar1 = *pbVar3;
  }
  else {
LAB_00102c1f:
    if (bVar1 == 0x5c) goto LAB_00102c01;
  }
  putchar((int)(char)bVar1);
  pbVar3 = pbVar3 + 1;
  goto LAB_00102bf2;
}

Assistant:

static void printJson(const Node* current) {
  assert(current);
  switch (current->type) {
    case NT_INVALID:
      break;
    case NT_INT:
      printf("%d", current->integer);
      break;
    case NT_STRING:
      printJsonString(current->string);
      break;
    case NT_ARRAY:
      putchar('[');
      if (current->next) printJson(current->next);
      putchar(']');
      break;
    case NT_MAP:
      putchar('{');
      if (current->next) printJson(current->next);
      putchar('}');
      break;
    case NT_MAP_ENTRY:
      printf("\"%s\":", current->string);
      printJson(current->value);
      if (current->next) {
        putchar(',');
        printJson(current->next);
      }
      break;
    case NT_ARRAY_ELEMENT:
      printJson(current->value);
      if (current->next) {
        putchar(',');
        printJson(current->next);
      }
      break;
  }
}